

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

NULLCArray NULLC::AllocArray(uint size,uint count,uint type)

{
  byte bVar1;
  ExternTypeInfo *pEVar2;
  void *pvVar3;
  int iVar4;
  char *pcVar5;
  NULLCArray NVar6;
  
  if ((ulong)count * (ulong)size < (ulong)globalMemoryLimit ||
      (ulong)count * (ulong)size - (ulong)globalMemoryLimit == 0) {
    pEVar2 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),type);
    bVar1 = pEVar2->defaultAlign;
    if (bVar1 < 5) {
      bVar1 = 4;
    }
    iVar4 = size * count;
    if (iVar4 == 0) {
      iVar4 = 4;
    }
    pvVar3 = AllocObject(iVar4 + (uint)bVar1,type);
    if (pvVar3 != (void *)0x0) {
      pcVar5 = (char *)((long)pvVar3 + (ulong)bVar1);
      *(uint *)((long)pvVar3 + ((ulong)bVar1 - 4)) = count;
      *(byte *)((long)pvVar3 + -8) = *(byte *)((long)pvVar3 + -8) | 0x10;
      goto LAB_0011a3a2;
    }
  }
  else {
    nullcThrowError("ERROR: can\'t allocate array with %u elements of size %u",count,size);
  }
  pcVar5 = (char *)0x0;
  count = 0;
LAB_0011a3a2:
  NVar6.len = count;
  NVar6.ptr = pcVar5;
  return NVar6;
}

Assistant:

NULLCArray NULLC::AllocArray(unsigned size, unsigned count, unsigned type)
{
	NULLCArray ret;

	ret.len = 0;
	ret.ptr = NULL;

	if((unsigned long long)size * count > globalMemoryLimit)
	{
		nullcThrowError("ERROR: can't allocate array with %u elements of size %u", count, size);
		return ret;
	}

	ExternTypeInfo &typeInfo = NULLC::linker->exTypes[type];

	unsigned arrayPadding = typeInfo.defaultAlign > 4 ? typeInfo.defaultAlign : 4;

	unsigned bytes = count * size;
	
	if(bytes == 0)
		bytes += 4;

	char *ptr = (char*)AllocObject(bytes + arrayPadding, type);

	if(!ptr)
		return ret;

	ret.len = count;
	ret.ptr = arrayPadding + ptr;

	((unsigned*)ret.ptr)[-1] = count;

	markerType *marker = (markerType*)(ptr - sizeof(markerType));
	*marker |= OBJECT_ARRAY;

	return ret;
}